

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFNMatrix<3,_TPZFlopCounter>::TPZFNMatrix
          (TPZFNMatrix<3,_TPZFlopCounter> *this,int64_t row,int64_t col,TPZFlopCounter *val)

{
  REAL *in_RCX;
  TPZFMatrix<TPZFlopCounter> *in_RDI;
  TPZFlopCounter *unaff_retaddr;
  int64_t in_stack_00000008;
  int64_t in_stack_00000010;
  void **in_stack_00000018;
  TPZFMatrix<TPZFlopCounter> *in_stack_00000020;
  TPZFMatrix<TPZFlopCounter> *local_50;
  TPZFMatrix<TPZFlopCounter> *sz;
  
  sz = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZFNMatrix<3,TPZFlopCounter>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  (in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0240d318;
  TPZFMatrix<TPZFlopCounter>::TPZFMatrix
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (int64_t)sz);
  (in_RDI->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0240d318;
  local_50 = in_RDI + 1;
  do {
    TPZFlopCounter::TPZFlopCounter((TPZFlopCounter *)local_50);
    local_50 = (TPZFMatrix<TPZFlopCounter> *)
               &(local_50->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
  } while (local_50 != (TPZFMatrix<TPZFlopCounter> *)&in_RDI[1].fElem);
  TPZFMatrix<TPZFlopCounter>::operator=(in_RDI,(TPZFlopCounter)*in_RCX);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }